

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O0

void __thiscall
QAbstractItemModelTesterPrivate::rowsAboutToBeRemoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  QDebug *pQVar5;
  QAbstractItemModel *pQVar6;
  QAbstractItemModel *pQVar7;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  QAbstractItemModelTesterPrivate *in_RDI;
  long in_FS_OFFSET;
  QModelIndex endIndex;
  QModelIndex startIndex;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  Changing c;
  undefined4 uVar8;
  int in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  QVariant *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  QPointer<QAbstractItemModel> *in_stack_fffffffffffffd78;
  QDebug *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  ChangeInFlight *in_stack_fffffffffffffe08;
  undefined1 *local_1d8;
  undefined1 *puStack_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1b8;
  undefined1 *puStack_1b0;
  undefined1 *local_1a8;
  undefined1 local_198 [24];
  int in_stack_fffffffffffffe80;
  QDebug local_130;
  QDebug local_128;
  QDebug local_120;
  QDebug local_118;
  QDebug local_110;
  QDebug local_108;
  undefined4 local_fc;
  undefined1 *local_f8;
  undefined1 *local_f0;
  QVariant local_e8;
  QVariant local_c8;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_fc = 0;
  uVar8 = 0x3b0;
  bVar1 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    ((QAbstractItemModelTesterPrivate *)CONCAT44(in_EDX,in_ECX),
                     in_stack_fffffffffffffe08,
                     (ChangeInFlight *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00)
                     ,(char *)in_RDI,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                     in_stack_fffffffffffffe80);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00192504;
  in_RDI->changeInFlight = RowsRemoved;
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  lcModelTest();
  anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd4c,uVar8));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_f8), bVar1) {
    anon_unknown.dwarf_21e2d9::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x191c77);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
               (char *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd54,
               (char *)CONCAT44(in_stack_fffffffffffffd4c,uVar8),(char *)0x191c96);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                       in_stack_fffffffffffffd4c);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                       in_stack_fffffffffffffd4c);
    pQVar5 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffd78,
                                (char *)in_stack_fffffffffffffda8);
    QDebug::QDebug(&local_128,pQVar5);
    ::operator<<((Stream *)&local_120,(QModelIndex *)&local_128);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x191dbd);
    (**(code **)(*(long *)pQVar7 + 0x90))(&local_28,pQVar7,in_RSI,0);
    QVariant::toString();
    in_stack_fffffffffffffda8 =
         QDebug::operator<<((QDebug *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                            (QString *)in_stack_fffffffffffffd58);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffda8);
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x191e39);
    (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,in_RSI);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                       in_stack_fffffffffffffd4c);
    pQVar5 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffd78,
                                (char *)in_stack_fffffffffffffda8);
    QDebug::QDebug(&local_118,pQVar5);
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x191ea5);
    (**(code **)(*(long *)pQVar7 + 0x60))(&stack0xfffffffffffffe80,pQVar7,in_EDX + -1,0,in_RSI);
    ::operator<<((Stream *)&local_110,(QModelIndex *)&local_118);
    in_stack_fffffffffffffd78 = &in_RDI->model;
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x191f03);
    pQVar6 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x191f12);
    (**(code **)(*(long *)pQVar6 + 0x60))(local_198,pQVar6,in_EDX + -1,0,in_RSI);
    (**(code **)(*(long *)pQVar7 + 0x90))(&local_48,pQVar7,local_198,0);
    ::operator<<(pQVar5,(QVariant *)pQVar7);
    QDebug::~QDebug(&local_108);
    QVariant::~QVariant(&local_48);
    QDebug::~QDebug(&local_110);
    QDebug::~QDebug(&local_118);
    QString::~QString((QString *)0x191fc0);
    QVariant::~QVariant(&local_28);
    QDebug::~QDebug(&local_120);
    QDebug::~QDebug(&local_128);
    QDebug::~QDebug(&local_130);
    local_f0 = (undefined1 *)((ulong)local_f0 & 0xffffffffffffff00);
  }
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  Changing::Changing((Changing *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  local_98 = (undefined1 *)in_RSI[2];
  local_a8 = (undefined1 *)*in_RSI;
  puStack_a0 = (undefined1 *)in_RSI[1];
  pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x1921bc);
  uVar2 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,in_RSI);
  puStack_90 = (undefined1 *)CONCAT44(puStack_90._4_4_,uVar2);
  if (in_EDX < 1) {
LAB_00192367:
    if (in_ECX < (int)puStack_90 + -1) {
      pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x192391);
      iVar3 = (**(code **)(*(long *)pQVar7 + 0x80))(pQVar7,in_RSI);
      if (0 < iVar3) {
        local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_1d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x1923ed);
        (**(code **)(*(long *)pQVar7 + 0x60))(&local_1d8,pQVar7,in_ECX + 1,0,in_RSI);
        bVar1 = QModelIndex::isValid
                          ((QModelIndex *)
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        uVar4 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)bVar1,(uchar *)"endIndex.isValid()",0x1b6819,
                       (uchar *)
                       "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                       ,0x3c3);
        if ((uVar4 & 1) == 0) goto LAB_001924f7;
        pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x192485);
        (**(code **)(*(long *)pQVar7 + 0x90))(&local_e8,pQVar7,&local_1d8,0);
        QVariant::operator=(in_stack_fffffffffffffd58,
                            (QVariant *)
                            CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        QVariant::~QVariant(&local_e8);
      }
    }
    QStack<QAbstractItemModelTesterPrivate::Changing>::push
              ((QStack<QAbstractItemModelTesterPrivate::Changing> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               (Changing *)CONCAT44(in_stack_fffffffffffffd4c,uVar8));
  }
  else {
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x192200);
    iVar3 = (**(code **)(*(long *)pQVar7 + 0x80))(pQVar7,in_RSI);
    if (iVar3 < 1) goto LAB_00192367;
    local_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x19225c);
    (**(code **)(*(long *)pQVar7 + 0x60))(&local_1b8,pQVar7,in_EDX + -1,0,in_RSI);
    bVar1 = QModelIndex::isValid
                      ((QModelIndex *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
    ;
    uVar4 = verify(in_RDI,(EVP_PKEY_CTX *)(ulong)bVar1,(uchar *)"startIndex.isValid()",0x1b6819,
                   (uchar *)
                   "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                   ,0x3be);
    if ((uVar4 & 1) != 0) {
      pQVar7 = QPointer<QAbstractItemModel>::operator->((QPointer<QAbstractItemModel> *)0x19231e);
      (**(code **)(*(long *)pQVar7 + 0x90))(&local_c8,pQVar7,&local_1b8,0);
      QVariant::operator=(in_stack_fffffffffffffd58,
                          (QVariant *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
      ;
      QVariant::~QVariant(&local_c8);
      goto LAB_00192367;
    }
  }
LAB_001924f7:
  Changing::~Changing((Changing *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
LAB_00192504:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsAboutToBeRemoved(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::RowsRemoved;

    qCDebug(lcModelTest) << "rowsAboutToBeRemoved"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before removal=" << model->index(start - 1, 0, parent) << model->data(model->index(start - 1, 0, parent));

    Changing c;
    c.parent = parent;
    c.oldSize = model->rowCount(parent);
    if (start > 0 && model->columnCount(parent) > 0) {
        const QModelIndex startIndex = model->index(start - 1, 0, parent);
        MODELTESTER_VERIFY(startIndex.isValid());
        c.last = model->data(startIndex);
    }
    if (end < c.oldSize - 1 && model->columnCount(parent) > 0) {
        const QModelIndex endIndex = model->index(end + 1, 0, parent);
        MODELTESTER_VERIFY(endIndex.isValid());
        c.next = model->data(endIndex);
    }

    remove.push(c);
}